

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall
ImVector<ImGuiPtrOrIndex>::push_back(ImVector<ImGuiPtrOrIndex> *this,ImGuiPtrOrIndex *v)

{
  int iVar1;
  ImGuiPtrOrIndex *pIVar2;
  undefined8 *in_RSI;
  ImVector<ImGuiPtrOrIndex> *in_RDI;
  ImVector<ImGuiPtrOrIndex> *unaff_retaddr;
  ImVector<ImGuiPtrOrIndex> *pIVar3;
  
  if (in_RDI->Size == in_RDI->Capacity) {
    pIVar3 = in_RDI;
    _grow_capacity(in_RDI,in_RDI->Size + 1);
    reserve(unaff_retaddr,(int)((ulong)pIVar3 >> 0x20));
  }
  pIVar2 = in_RDI->Data;
  iVar1 = in_RDI->Size;
  pIVar2[iVar1].Ptr = (void *)*in_RSI;
  *(undefined8 *)&pIVar2[iVar1].Index = in_RSI[1];
  in_RDI->Size = in_RDI->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }